

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_char.c
# Opt level: O2

int bin_char_equal(char *vec1,char *vec2,int len)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  
  uVar1 = 0;
  uVar3 = (ulong)(uint)len;
  if (len < 1) {
    uVar3 = uVar1;
  }
  iVar2 = 0;
  for (; uVar3 != uVar1; uVar1 = uVar1 + 1) {
    iVar2 = iVar2 + (char)(vec2[uVar1] ^ vec1[uVar1]);
  }
  return (int)(iVar2 == 0);
}

Assistant:

int bin_char_equal(char *vec1, char *vec2, int len)
    {
        int sum=0;
        for(int i=0; i<len; i++)
            {
                sum+=vec1[i]^vec2[i];
                // printf("\n%i\n",sum);
            }
        if(sum==0) return 1;
        else return 0;
    }